

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>
          *f,allocator<void> *a)

{
  undefined8 uVar1;
  error_category *peVar2;
  undefined4 uVar3;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  *piVar4;
  ptr local_30;
  
  local_30.a = a;
  piVar4 = impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
           ::ptr::allocate(a);
  local_30.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)0x0;
  uVar1 = *(undefined8 *)&(f->handler_).field_0x8;
  (piVar4->function_).handler_._M_f = (f->handler_)._M_f;
  *(undefined8 *)&(piVar4->function_).handler_.field_0x8 = uVar1;
  (piVar4->function_).handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl =
       (f->handler_)._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>_>.
       super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl;
  uVar3 = *(undefined4 *)&(f->arg1_).field_0x4;
  peVar2 = (f->arg1_)._M_cat;
  (piVar4->function_).arg1_._M_value = (f->arg1_)._M_value;
  *(undefined4 *)&(piVar4->function_).arg1_.field_0x4 = uVar3;
  (piVar4->function_).arg1_._M_cat = peVar2;
  (piVar4->super_impl_base).complete_ =
       complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>,std::error_code>,std::allocator<void>>
  ;
  this->impl_ = &piVar4->super_impl_base;
  local_30.v = (void *)0x0;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr(&local_30);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }